

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.h
# Opt level: O3

bool Js::VarIs<Js::StackScriptFunction>(Var aValue)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/RecyclableObject.h"
                                ,0x1ec,"(aValue != nullptr)","VarIs: aValue is null");
    if (!bVar2) goto LAB_00a6bcad;
    *puVar3 = 0;
  }
  else if ((ulong)aValue >> 0x30 != 0) {
    return false;
  }
  bVar2 = VarIs<Js::ScriptFunction,Js::RecyclableObject>((RecyclableObject *)aValue);
  if (!bVar2) {
    return false;
  }
  bVar2 = ThreadContext::IsOnStack(aValue);
  if (bVar2) {
    return true;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/StackScriptFunction.h"
                              ,100,"(ThreadContext::IsOnStack(obj))","ThreadContext::IsOnStack(obj)"
                             );
  if (bVar2) {
    *puVar3 = 0;
    return true;
  }
LAB_00a6bcad:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool VarIs(Var aValue)
    {
        AssertMsg(aValue != nullptr, "VarIs: aValue is null");

#if INT32VAR
        bool isRecyclableObject = (((uintptr_t)aValue) >> VarTag_Shift) == 0;
#else
        bool isRecyclableObject = (((uintptr_t)aValue) & AtomTag) == AtomTag_Object;
#endif

        return isRecyclableObject && VarIsImpl<T>(reinterpret_cast<RecyclableObject*>(aValue));
    }